

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber_test.cc
# Opt level: O3

void KyberFileTest(FileTest *t)

{
  void *pvVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long *plVar3;
  int iVar4;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  char *pcVar5;
  pointer pcVar6;
  char *in_R9;
  pointer *__ptr;
  vector<unsigned_char,_std::allocator<unsigned_char>_> copy_6;
  uint8_t corrupted_decapsulated_key [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> copy_7;
  CBB cbb;
  vector<unsigned_char,_std::allocator<unsigned_char>_> seed;
  vector<unsigned_char,_std::allocator<unsigned_char>_> given_encap_entropy_pre_hash;
  vector<unsigned_char,_std::allocator<unsigned_char>_> given_generate_entropy;
  vector<unsigned_char,_std::allocator<unsigned_char>_> shared_secret_expected;
  vector<unsigned_char,_std::allocator<unsigned_char>_> ciphertext_expected;
  vector<unsigned_char,_std::allocator<unsigned_char>_> private_key_expected;
  vector<unsigned_char,_std::allocator<unsigned_char>_> public_key_expected;
  uint8_t encapsulated_key [32];
  uint8_t encap_entropy [32];
  uint8_t corrupted_ciphertext [1088];
  uint8_t decapsulated_key [32];
  uint8_t gen_key_entropy [64];
  CBS encoded_public_key_cbs;
  uint8_t encoded_public_key [1184];
  uint8_t encoded_private_key [2400];
  KYBER_private_key priv;
  KYBER_public_key pub;
  uint8_t ciphertext [1088];
  undefined1 local_4f80 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4f78;
  long local_4f70;
  undefined1 local_4f68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4f60;
  long local_4f58;
  Bytes local_4f48;
  long local_4f38;
  allocator_type local_4f29;
  undefined1 local_4f28 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4f20;
  undefined1 local_4ef8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4ef0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_4ee8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_4ec8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_4ea8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_4e88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_4e68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_4e48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_4e28;
  Bytes local_4e08;
  uint8_t local_4df8 [32];
  uint8_t local_4dd8 [32];
  undefined1 local_4db8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4db0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4da8 [67];
  uint8_t local_4978 [32];
  uint8_t local_4958 [32];
  uint8_t local_4938 [32];
  Bytes local_4918;
  CBS local_4908;
  AssertHelper local_48f8 [148];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_4458 [300];
  undefined1 local_3af8 [7776];
  undefined1 local_1c98 [6208];
  uint8_t local_458 [1088];
  
  local_4ee8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (uint8_t *)0x0;
  local_4ee8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4ee8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4e28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4e28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_4e28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4e48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4e48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_4e48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4e68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4e68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_4e68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4e88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4e88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_4e88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4ea8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4ea8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_4ea8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4ec8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4ec8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_4ec8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pcVar5 = local_3af8 + 0x10;
  local_3af8._0_8_ = pcVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3af8,"count","");
  FileTest::HasAttribute(t,(string *)local_3af8);
  if ((char *)local_3af8._0_8_ != pcVar5) {
    operator_delete((void *)local_3af8._0_8_,local_3af8._16_8_ + 1);
  }
  local_3af8._0_8_ = pcVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3af8,"seed","");
  local_1c98[0] = FileTest::GetBytes(t,&local_4ee8,(string *)local_3af8);
  local_1c98._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((char *)local_3af8._0_8_ == pcVar5) {
    if ((bool)local_1c98[0]) goto LAB_0030f15f;
LAB_0030f6bf:
    testing::Message::Message((Message *)local_4458);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_3af8,(internal *)local_1c98,
               (AssertionResult *)"t->GetBytes(&seed, \"seed\")","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (local_48f8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
               ,0x77,(char *)local_3af8._0_8_);
    testing::internal::AssertHelper::operator=(local_48f8,(Message *)local_4458);
LAB_0030fa28:
    this = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)(local_1c98 + 8);
    testing::internal::AssertHelper::~AssertHelper(local_48f8);
    if ((char *)local_3af8._0_8_ != pcVar5) {
      operator_delete((void *)local_3af8._0_8_,local_3af8._16_8_ + 1);
    }
    local_4db0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1c98._8_8_;
    if (local_4458[0]._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_4458[0]._M_head_impl + 8))();
      local_4db0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_1c98._8_8_;
    }
LAB_0030fa6d:
    if (local_4db0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0030fa7a;
  }
  else {
    operator_delete((void *)local_3af8._0_8_,local_3af8._16_8_ + 1);
    if ((local_1c98[0] & 1) == 0) goto LAB_0030f6bf;
LAB_0030f15f:
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c98._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_1c98 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_1c98._8_8_);
    }
    local_3af8._0_8_ = pcVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3af8,"pk","");
    local_1c98[0] = FileTest::GetBytes(t,&local_4e28,(string *)local_3af8);
    local_1c98._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((char *)local_3af8._0_8_ != pcVar5) {
      operator_delete((void *)local_3af8._0_8_,local_3af8._16_8_ + 1);
      if ((local_1c98[0] & 1) != 0) goto LAB_0030f1ec;
LAB_0030f73e:
      testing::Message::Message((Message *)local_4458);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_3af8,(internal *)local_1c98,
                 (AssertionResult *)"t->GetBytes(&public_key_expected, \"pk\")","false","true",in_R9
                );
      testing::internal::AssertHelper::AssertHelper
                (local_48f8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                 ,0x78,(char *)local_3af8._0_8_);
      testing::internal::AssertHelper::operator=(local_48f8,(Message *)local_4458);
      goto LAB_0030fa28;
    }
    if (!(bool)local_1c98[0]) goto LAB_0030f73e;
LAB_0030f1ec:
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c98._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_1c98 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_1c98._8_8_);
    }
    local_3af8._0_8_ = pcVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3af8,"sk","");
    local_1c98[0] = FileTest::GetBytes(t,&local_4e48,(string *)local_3af8);
    local_1c98._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((char *)local_3af8._0_8_ == pcVar5) {
      if (!(bool)local_1c98[0]) goto LAB_0030f7bd;
    }
    else {
      operator_delete((void *)local_3af8._0_8_,local_3af8._16_8_ + 1);
      if ((local_1c98[0] & 1) == 0) {
LAB_0030f7bd:
        testing::Message::Message((Message *)local_4458);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_3af8,(internal *)local_1c98,
                   (AssertionResult *)"t->GetBytes(&private_key_expected, \"sk\")","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (local_48f8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                   ,0x79,(char *)local_3af8._0_8_);
        testing::internal::AssertHelper::operator=(local_48f8,(Message *)local_4458);
        goto LAB_0030fa28;
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c98._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_1c98 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_1c98._8_8_);
    }
    local_3af8._0_8_ = pcVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3af8,"ct","");
    local_1c98[0] = FileTest::GetBytes(t,&local_4e68,(string *)local_3af8);
    local_1c98._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((char *)local_3af8._0_8_ == pcVar5) {
      if (!(bool)local_1c98[0]) goto LAB_0030f83c;
    }
    else {
      operator_delete((void *)local_3af8._0_8_,local_3af8._16_8_ + 1);
      if ((local_1c98[0] & 1) == 0) {
LAB_0030f83c:
        testing::Message::Message((Message *)local_4458);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_3af8,(internal *)local_1c98,
                   (AssertionResult *)"t->GetBytes(&ciphertext_expected, \"ct\")","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (local_48f8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                   ,0x7a,(char *)local_3af8._0_8_);
        testing::internal::AssertHelper::operator=(local_48f8,(Message *)local_4458);
        goto LAB_0030fa28;
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c98._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_1c98 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_1c98._8_8_);
    }
    local_3af8._0_8_ = pcVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3af8,"ss","");
    local_1c98[0] = FileTest::GetBytes(t,&local_4e88,(string *)local_3af8);
    local_1c98._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((char *)local_3af8._0_8_ == pcVar5) {
      if (!(bool)local_1c98[0]) goto LAB_0030f8bb;
    }
    else {
      operator_delete((void *)local_3af8._0_8_,local_3af8._16_8_ + 1);
      if ((local_1c98[0] & 1) == 0) {
LAB_0030f8bb:
        testing::Message::Message((Message *)local_4458);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_3af8,(internal *)local_1c98,
                   (AssertionResult *)"t->GetBytes(&shared_secret_expected, \"ss\")","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (local_48f8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                   ,0x7b,(char *)local_3af8._0_8_);
        testing::internal::AssertHelper::operator=(local_48f8,(Message *)local_4458);
        goto LAB_0030fa28;
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c98._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_1c98 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_1c98._8_8_);
    }
    local_3af8._0_8_ = pcVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3af8,"generateEntropy","");
    local_1c98[0] = FileTest::GetBytes(t,&local_4ea8,(string *)local_3af8);
    local_1c98._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((char *)local_3af8._0_8_ == pcVar5) {
      if (!(bool)local_1c98[0]) goto LAB_0030f93a;
    }
    else {
      operator_delete((void *)local_3af8._0_8_,local_3af8._16_8_ + 1);
      if ((local_1c98[0] & 1) == 0) {
LAB_0030f93a:
        testing::Message::Message((Message *)local_4458);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_3af8,(internal *)local_1c98,
                   (AssertionResult *)"t->GetBytes(&given_generate_entropy, \"generateEntropy\")",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (local_48f8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                   ,0x7c,(char *)local_3af8._0_8_);
        testing::internal::AssertHelper::operator=(local_48f8,(Message *)local_4458);
        goto LAB_0030fa28;
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c98._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_1c98 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_1c98._8_8_);
    }
    local_3af8._0_8_ = pcVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3af8,"encapEntropyPreHash","");
    local_1c98[0] = FileTest::GetBytes(t,&local_4ec8,(string *)local_3af8);
    local_1c98._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((char *)local_3af8._0_8_ == pcVar5) {
      if (!(bool)local_1c98[0]) goto LAB_0030f9b6;
    }
    else {
      operator_delete((void *)local_3af8._0_8_,local_3af8._16_8_ + 1);
      if ((local_1c98[0] & 1) == 0) {
LAB_0030f9b6:
        testing::Message::Message((Message *)local_4458);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_3af8,(internal *)local_1c98,
                   (AssertionResult *)
                   "t->GetBytes(&given_encap_entropy_pre_hash, \"encapEntropyPreHash\")","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (local_48f8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                   ,0x7e,(char *)local_3af8._0_8_);
        testing::internal::AssertHelper::operator=(local_48f8,(Message *)local_4458);
        goto LAB_0030fa28;
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c98._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_1c98 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_1c98._8_8_);
    }
    local_4f28 = (undefined1  [8])
                 ((long)local_4ee8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_4ee8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start);
    local_4f68 = (undefined1  [8])0x30;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_4db8,"seed.size()","size_t{48}",(unsigned_long *)local_4f28,
               (unsigned_long *)local_4f68);
    if (local_4db8[0] != (internal)0x0) {
      if (local_4db0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_4db0,local_4db0);
      }
      local_4f68 = (undefined1  [8])
                   CTR_DRBG_new(local_4ee8.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,(uint8_t *)0x0,0);
      local_4f28[0] =
           (internal)
           ((tuple<ctr_drbg_state_st_*,_bssl::internal::Deleter>)local_4f68 !=
           (_Head_base<0UL,_ctr_drbg_state_st_*,_false>)0x0);
      local_4f20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((tuple<ctr_drbg_state_st_*,_bssl::internal::Deleter>)local_4f68 ==
          (_Head_base<0UL,_ctr_drbg_state_st_*,_false>)0x0) {
        testing::Message::Message((Message *)local_4f80);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_4db8,(internal *)local_4f28,(AssertionResult *)"state","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_4f48,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                   ,0x90,(char *)CONCAT44(local_4db8._4_4_,
                                          CONCAT13(local_4db8[3],
                                                   CONCAT21(local_4db8._1_2_,local_4db8[0]))));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&local_4f48,(Message *)local_4f80);
LAB_0030fd83:
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4f48);
        paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)CONCAT44(local_4db8._4_4_,
                             CONCAT13(local_4db8[3],CONCAT21(local_4db8._1_2_,local_4db8[0])));
        if (paVar2 != local_4da8) {
          operator_delete(paVar2,local_4da8[0]._M_allocated_capacity + 1);
        }
        if (local_4f80 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_4f80 + 8))();
        }
        if (local_4f20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_4f20,local_4f20);
        }
        std::unique_ptr<ctr_drbg_state_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<ctr_drbg_state_st,_bssl::internal::Deleter> *)local_4f68);
        goto LAB_0030fa7a;
      }
      iVar4 = CTR_DRBG_generate((CTR_DRBG_STATE *)local_4f68,local_4958,0x20,(uint8_t *)0x0,0);
      local_4f28[0] = (internal)(iVar4 != 0);
      local_4f20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar4 == 0) {
        testing::Message::Message((Message *)local_4f80);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_4db8,(internal *)local_4f28,
                   (AssertionResult *)
                   "CTR_DRBG_generate(state.get(), gen_key_entropy, 32, nullptr, 0)","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_4f48,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                   ,0x92,(char *)CONCAT44(local_4db8._4_4_,
                                          CONCAT13(local_4db8[3],
                                                   CONCAT21(local_4db8._1_2_,local_4db8[0]))));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&local_4f48,(Message *)local_4f80);
        goto LAB_0030fd83;
      }
      iVar4 = CTR_DRBG_generate((CTR_DRBG_STATE *)local_4f68,local_4938,0x20,(uint8_t *)0x0,0);
      local_4f28[0] = (internal)(iVar4 != 0);
      local_4f20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar4 == 0) {
        testing::Message::Message((Message *)local_4f80);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_4db8,(internal *)local_4f28,
                   (AssertionResult *)
                   "CTR_DRBG_generate(state.get(), gen_key_entropy + 32, 32, nullptr, 0)","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_4f48,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                   ,0x94,(char *)CONCAT44(local_4db8._4_4_,
                                          CONCAT13(local_4db8[3],
                                                   CONCAT21(local_4db8._1_2_,local_4db8[0]))));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&local_4f48,(Message *)local_4f80);
        goto LAB_0030fd83;
      }
      iVar4 = CTR_DRBG_generate((CTR_DRBG_STATE *)local_4f68,local_4dd8,0x20,(uint8_t *)0x0,0);
      local_4f28[0] = (internal)(iVar4 != 0);
      local_4f20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar4 == 0) {
        testing::Message::Message((Message *)local_4f80);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_4db8,(internal *)local_4f28,
                   (AssertionResult *)
                   "CTR_DRBG_generate(state.get(), encap_entropy, 32, nullptr, 0)","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_4f48,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                   ,0x96,(char *)CONCAT44(local_4db8._4_4_,
                                          CONCAT13(local_4db8[3],
                                                   CONCAT21(local_4db8._1_2_,local_4db8[0]))));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&local_4f48,(Message *)local_4f80);
        goto LAB_0030fd83;
      }
      std::unique_ptr<ctr_drbg_state_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<ctr_drbg_state_st,_bssl::internal::Deleter> *)local_4f68);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_4db8,local_4958,
                 (uchar *)&local_4918,(allocator_type *)local_4f80);
      local_4f60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)local_4db0 -
                   CONCAT44(local_4db8._4_4_,
                            CONCAT13(local_4db8[3],CONCAT21(local_4db8._1_2_,local_4db8[0]))));
      local_4f78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)local_4ea8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)local_4ea8.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start);
      local_4f80 = (undefined1  [8])
                   local_4ea8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
      testing::internal::CmpHelperEQ<Bytes,Bytes>
                ((internal *)local_4f28,"Bytes(Declassified(gen_key_entropy))",
                 "Bytes(given_generate_entropy)",(Bytes *)local_4f68,(Bytes *)local_4f80);
      pvVar1 = (void *)CONCAT44(local_4db8._4_4_,
                                CONCAT13(local_4db8[3],CONCAT21(local_4db8._1_2_,local_4db8[0])));
      if (pvVar1 != (void *)0x0) {
        operator_delete(pvVar1,local_4da8[0]._M_allocated_capacity - (long)pvVar1);
      }
      if (local_4f28[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_4db8);
        if (local_4f20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          pcVar5 = "";
        }
        else {
          pcVar5 = (local_4f20->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_4f68,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                   ,0x9a,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_4f68,(Message *)local_4db8)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4f68);
        plVar3 = (long *)CONCAT44(local_4db8._4_4_,
                                  CONCAT13(local_4db8[3],CONCAT21(local_4db8._1_2_,local_4db8[0])));
        if (plVar3 != (long *)0x0) {
          (**(code **)(*plVar3 + 8))();
        }
      }
      if (local_4f20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_4f20,local_4f20);
      }
      std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_4db8,local_4dd8,
                 local_4db8,(allocator_type *)local_4f80);
      local_4f68._1_2_ = local_4db8._1_2_;
      local_4f68[0] = local_4db8[0];
      local_4f68[3] = local_4db8[3];
      local_4f68._4_4_ = local_4db8._4_4_;
      local_4f60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)local_4db0 - (long)local_4f68);
      local_4f78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_4ec8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
                   -(long)local_4ec8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
      local_4f80 = (undefined1  [8])
                   local_4ec8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
      testing::internal::CmpHelperEQ<Bytes,Bytes>
                ((internal *)local_4f28,"Bytes(Declassified(encap_entropy))",
                 "Bytes(given_encap_entropy_pre_hash)",(Bytes *)local_4f68,(Bytes *)local_4f80);
      pvVar1 = (void *)CONCAT44(local_4db8._4_4_,
                                CONCAT13(local_4db8[3],CONCAT21(local_4db8._1_2_,local_4db8[0])));
      if (pvVar1 != (void *)0x0) {
        operator_delete(pvVar1,local_4da8[0]._M_allocated_capacity - (long)pvVar1);
      }
      if (local_4f28[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_4db8);
        if (local_4f20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          pcVar5 = "";
        }
        else {
          pcVar5 = (local_4f20->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_4f68,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                   ,0x9c,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_4f68,(Message *)local_4db8)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4f68);
        plVar3 = (long *)CONCAT44(local_4db8._4_4_,
                                  CONCAT13(local_4db8[3],CONCAT21(local_4db8._1_2_,local_4db8[0])));
        if (plVar3 != (long *)0x0) {
          (**(code **)(*plVar3 + 8))();
        }
      }
      if (local_4f20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_4f20,local_4f20);
      }
      BORINGSSL_keccak(local_4dd8,0x20,local_4dd8,0x20,boringssl_sha3_256);
      KYBER_generate_key_external_entropy
                ((uint8_t *)local_48f8,(KYBER_private_key *)local_3af8,local_4958);
      CBB_init_fixed((CBB *)local_4f28,(uint8_t *)local_4458,0x960);
      iVar4 = KYBER_marshal_private_key((CBB *)local_4f28,(KYBER_private_key *)local_3af8);
      local_4f68[0] = (internal)(iVar4 != 0);
      local_4f60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar4 == 0) {
        testing::Message::Message((Message *)local_4f80);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_4db8,(internal *)local_4f68,
                   (AssertionResult *)"KYBER_marshal_private_key(&cbb, &priv)","false","true",in_R9)
        ;
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_4f48,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                   ,0xa5,(char *)CONCAT44(local_4db8._4_4_,
                                          CONCAT13(local_4db8[3],
                                                   CONCAT21(local_4db8._1_2_,local_4db8[0]))));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&local_4f48,(Message *)local_4f80);
      }
      else {
        local_4908.len = 0x4a0;
        local_4908.data = (uint8_t *)local_48f8;
        iVar4 = KYBER_parse_public_key((KYBER_public_key *)local_1c98,&local_4908);
        local_4f68[0] = (internal)(iVar4 != 0);
        local_4f60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar4 != 0) {
          KYBER_encap_external_entropy
                    (local_458,local_4df8,(KYBER_public_key *)local_1c98,local_4dd8);
          KYBER_decap(local_4978,local_458,(KYBER_private_key *)local_3af8);
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          vector<unsigned_char_const*,void>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_4db8,local_4df8,
                     local_4dd8,(allocator_type *)local_4f68);
          local_4f48.span_.size_ =
               (long)local_4db0 -
               CONCAT44(local_4db8._4_4_,
                        CONCAT13(local_4db8[3],CONCAT21(local_4db8._1_2_,local_4db8[0])));
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          vector<unsigned_char_const*,void>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_4f68,local_4978,
                     local_4958,(allocator_type *)&local_4e08);
          local_4ef0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)local_4f60 - (long)local_4f68);
          local_4ef8 = local_4f68;
          testing::internal::CmpHelperEQ<Bytes,Bytes>
                    ((internal *)local_4f80,"Bytes(Declassified(encapsulated_key))",
                     "Bytes(Declassified(decapsulated_key))",&local_4f48,(Bytes *)local_4ef8);
          if (local_4f68 != (undefined1  [8])0x0) {
            operator_delete((void *)local_4f68,local_4f58 - (long)local_4f68);
          }
          pvVar1 = (void *)CONCAT44(local_4db8._4_4_,
                                    CONCAT13(local_4db8[3],CONCAT21(local_4db8._1_2_,local_4db8[0]))
                                   );
          if (pvVar1 != (void *)0x0) {
            operator_delete(pvVar1,local_4da8[0]._M_allocated_capacity - (long)pvVar1);
          }
          if (local_4f80[0] == (allocator_type)0x0) {
            testing::Message::Message((Message *)local_4db8);
            if (local_4f78 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar5 = "";
            }
            else {
              pcVar5 = (local_4f78->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_4f68,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                       ,0xaf,pcVar5);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)local_4f68,(Message *)local_4db8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4f68);
            plVar3 = (long *)CONCAT44(local_4db8._4_4_,
                                      CONCAT13(local_4db8[3],
                                               CONCAT21(local_4db8._1_2_,local_4db8[0])));
            if (plVar3 != (long *)0x0) {
              (**(code **)(*plVar3 + 8))();
            }
          }
          if (local_4f78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
             ) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_4f78,local_4f78);
          }
          local_4f78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)local_4e48.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_4e48.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
          local_4f80 = (undefined1  [8])
                       local_4e48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          vector<unsigned_char_const*,void>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_4db8,
                     (uchar *)local_4458,local_3af8,(allocator_type *)local_4ef8);
          local_4f48.span_.size_ =
               (long)local_4db0 -
               CONCAT44(local_4db8._4_4_,
                        CONCAT13(local_4db8[3],CONCAT21(local_4db8._1_2_,local_4db8[0])));
          testing::internal::CmpHelperEQ<Bytes,Bytes>
                    ((internal *)local_4f68,"Bytes(private_key_expected)",
                     "Bytes(Declassified(encoded_private_key))",(Bytes *)local_4f80,&local_4f48);
          pvVar1 = (void *)CONCAT44(local_4db8._4_4_,
                                    CONCAT13(local_4db8[3],CONCAT21(local_4db8._1_2_,local_4db8[0]))
                                   );
          if (pvVar1 != (void *)0x0) {
            operator_delete(pvVar1,local_4da8[0]._M_allocated_capacity - (long)pvVar1);
          }
          if (local_4f68[0] == (internal)0x0) {
            testing::Message::Message((Message *)local_4db8);
            if (local_4f60 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar6 = "";
            }
            else {
              pcVar6 = (local_4f60->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_4f80,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                       ,0xb1,pcVar6);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)local_4f80,(Message *)local_4db8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4f80);
            plVar3 = (long *)CONCAT44(local_4db8._4_4_,
                                      CONCAT13(local_4db8[3],
                                               CONCAT21(local_4db8._1_2_,local_4db8[0])));
            if (plVar3 != (long *)0x0) {
              (**(code **)(*plVar3 + 8))();
            }
          }
          if (local_4f60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
             ) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_4f60,local_4f60);
          }
          local_4f60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)local_4e28.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_4e28.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
          local_4f68 = (undefined1  [8])
                       local_4e28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
          local_4f78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4a0;
          local_4f80 = (undefined1  [8])local_48f8;
          testing::internal::CmpHelperEQ<Bytes,Bytes>
                    ((internal *)local_4db8,"Bytes(public_key_expected)","Bytes(encoded_public_key)"
                     ,(Bytes *)local_4f68,(Bytes *)local_4f80);
          if (local_4db8[0] == (internal)0x0) {
            testing::Message::Message((Message *)local_4f68);
            if (local_4db0 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar5 = "";
            }
            else {
              pcVar5 = (local_4db0->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_4f80,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                       ,0xb2,pcVar5);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)local_4f80,(Message *)local_4f68);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4f80);
            if (local_4f68 != (undefined1  [8])0x0) {
              (**(code **)(*(long *)((AES_KEY *)local_4f68)->rd_key + 8))();
            }
          }
          if (local_4db0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
             ) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_4db0,local_4db0);
          }
          local_4f60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_4e68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                        ._M_impl.super__Vector_impl_data._M_finish +
                       -(long)local_4e68.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
          local_4f68 = (undefined1  [8])
                       local_4e68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
          local_4f78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x440;
          local_4f80 = (undefined1  [8])local_458;
          testing::internal::CmpHelperEQ<Bytes,Bytes>
                    ((internal *)local_4db8,"Bytes(ciphertext_expected)","Bytes(ciphertext)",
                     (Bytes *)local_4f68,(Bytes *)local_4f80);
          if (local_4db8[0] == (internal)0x0) {
            testing::Message::Message((Message *)local_4f68);
            if (local_4db0 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar5 = "";
            }
            else {
              pcVar5 = (local_4db0->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_4f80,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                       ,0xb3,pcVar5);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)local_4f80,(Message *)local_4f68);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4f80);
            if (local_4f68 != (undefined1  [8])0x0) {
              (**(code **)(*(long *)((AES_KEY *)local_4f68)->rd_key + 8))();
            }
          }
          if (local_4db0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
             ) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_4db0,local_4db0);
          }
          local_4f78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_4e88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                        ._M_impl.super__Vector_impl_data._M_finish +
                       -(long)local_4e88.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
          local_4f80 = (undefined1  [8])
                       local_4e88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          vector<unsigned_char_const*,void>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_4db8,local_4df8,
                     local_4dd8,(allocator_type *)local_4ef8);
          local_4f48.span_.data_ =
               (uchar *)CONCAT44(local_4db8._4_4_,
                                 CONCAT13(local_4db8[3],CONCAT21(local_4db8._1_2_,local_4db8[0])));
          local_4f48.span_.size_ = (long)local_4db0 - (long)local_4f48.span_.data_;
          testing::internal::CmpHelperEQ<Bytes,Bytes>
                    ((internal *)local_4f68,"Bytes(shared_secret_expected)",
                     "Bytes(Declassified(encapsulated_key))",(Bytes *)local_4f80,&local_4f48);
          pvVar1 = (void *)CONCAT44(local_4db8._4_4_,
                                    CONCAT13(local_4db8[3],CONCAT21(local_4db8._1_2_,local_4db8[0]))
                                   );
          if (pvVar1 != (void *)0x0) {
            operator_delete(pvVar1,local_4da8[0]._M_allocated_capacity - (long)pvVar1);
          }
          if (local_4f68[0] == (internal)0x0) {
            testing::Message::Message((Message *)local_4db8);
            if (local_4f60 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar5 = "";
            }
            else {
              pcVar5 = (local_4f60->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_4f80,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                       ,0xb5,pcVar5);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)local_4f80,(Message *)local_4db8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4f80);
            plVar3 = (long *)CONCAT44(local_4db8._4_4_,
                                      CONCAT13(local_4db8[3],
                                               CONCAT21(local_4db8._1_2_,local_4db8[0])));
            if (plVar3 != (long *)0x0) {
              (**(code **)(*plVar3 + 8))();
            }
          }
          if (local_4f60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
             ) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_4f60,local_4f60);
          }
          memcpy(local_4db8,local_458,0x440);
          local_4db8[3] = local_4db8[3] ^ 0x40;
          KYBER_decap(local_4f68,local_4db8,(KYBER_private_key *)local_3af8);
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          vector<unsigned_char_const*,void>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_4f80,local_4df8,
                     local_4dd8,(allocator_type *)&local_4f48);
          local_4e08.span_.size_ = (long)local_4f78 - (long)local_4f80;
          local_4e08.span_.data_ = (uchar *)local_4f80;
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          vector<unsigned_char_const*,void>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_4f48,local_4f68,
                     (uchar *)&local_4f48,&local_4f29);
          local_4918.span_.size_ = local_4f48.span_.size_ - (long)local_4f48.span_.data_;
          local_4918.span_.data_ = local_4f48.span_.data_;
          testing::internal::CmpHelperNE<Bytes,Bytes>
                    ((internal *)local_4ef8,"Bytes(Declassified(encapsulated_key))",
                     "Bytes(Declassified(corrupted_decapsulated_key))",&local_4e08,&local_4918);
          if (local_4f48.span_.data_ != (uchar *)0x0) {
            operator_delete(local_4f48.span_.data_,local_4f38 - (long)local_4f48.span_.data_);
          }
          if (local_4f80 != (undefined1  [8])0x0) {
            operator_delete((void *)local_4f80,local_4f70 - (long)local_4f80);
          }
          if (local_4ef8[0] == (allocator_type)0x0) {
            testing::Message::Message((Message *)local_4f80);
            if (local_4ef0 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar6 = "";
            }
            else {
              pcVar6 = (local_4ef0->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_4f48,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                       ,0xc0,pcVar6);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_4f48,(Message *)local_4f80);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4f48);
            if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 )local_4f80 !=
                (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 )0x0) {
              (**(code **)(*(long *)local_4f80 + 8))();
            }
          }
          if (local_4ef0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
             ) goto LAB_0030fa7a;
          this = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_4ef0;
          local_4db0 = local_4ef0;
          goto LAB_0030fa75;
        }
        testing::Message::Message((Message *)local_4f80);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_4db8,(internal *)local_4f68,
                   (AssertionResult *)"KYBER_parse_public_key(&pub, &encoded_public_key_cbs)",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_4f48,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                   ,0xa9,(char *)CONCAT44(local_4db8._4_4_,
                                          CONCAT13(local_4db8[3],
                                                   CONCAT21(local_4db8._1_2_,local_4db8[0]))));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&local_4f48,(Message *)local_4f80);
      }
      this = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_4f60;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4f48);
      paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)CONCAT44(local_4db8._4_4_,
                           CONCAT13(local_4db8[3],CONCAT21(local_4db8._1_2_,local_4db8[0])));
      if (paVar2 != local_4da8) {
        operator_delete(paVar2,local_4da8[0]._M_allocated_capacity + 1);
      }
      local_4db0 = local_4f60;
      if (local_4f80 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_4f80 + 8))();
        local_4db0 = local_4f60;
      }
      goto LAB_0030fa6d;
    }
    testing::Message::Message((Message *)local_4f28);
    if (local_4db0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (local_4db0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_4f68,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
               ,0x8b,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_4f68,(Message *)local_4f28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4f68);
    if (local_4f28 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_4f28 + 8))();
    }
    if (local_4db0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0030fa7a;
    this = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)&local_4db0;
  }
LAB_0030fa75:
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this,local_4db0);
LAB_0030fa7a:
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_4ec8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(local_4ec8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_4ec8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_4ec8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_4ea8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(local_4ea8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_4ea8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_4ea8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_4e88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(local_4e88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_4e88.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_4e88.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((CTR_DRBG_STATE *)
      local_4e68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (CTR_DRBG_STATE *)0x0) {
    operator_delete(local_4e68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_4e68.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_4e68.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_4e48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(local_4e48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_4e48.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_4e48.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((ctr_drbg_state_st *)
      local_4e28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (ctr_drbg_state_st *)0x0) {
    operator_delete(local_4e28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_4e28.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_4e28.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_4ee8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint8_t *)0x0) {
    operator_delete(local_4ee8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_4ee8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_4ee8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void KyberFileTest(FileTest *t) {
  std::vector<uint8_t> seed, public_key_expected, private_key_expected,
      ciphertext_expected, shared_secret_expected, given_generate_entropy,
      given_encap_entropy_pre_hash;
  t->IgnoreAttribute("count");
  ASSERT_TRUE(t->GetBytes(&seed, "seed"));
  ASSERT_TRUE(t->GetBytes(&public_key_expected, "pk"));
  ASSERT_TRUE(t->GetBytes(&private_key_expected, "sk"));
  ASSERT_TRUE(t->GetBytes(&ciphertext_expected, "ct"));
  ASSERT_TRUE(t->GetBytes(&shared_secret_expected, "ss"));
  ASSERT_TRUE(t->GetBytes(&given_generate_entropy, "generateEntropy"));
  ASSERT_TRUE(
      t->GetBytes(&given_encap_entropy_pre_hash, "encapEntropyPreHash"));

  KYBER_private_key priv;
  uint8_t encoded_private_key[KYBER_PRIVATE_KEY_BYTES];
  KYBER_public_key pub;
  uint8_t encoded_public_key[KYBER_PUBLIC_KEY_BYTES];
  uint8_t ciphertext[KYBER_CIPHERTEXT_BYTES];
  uint8_t gen_key_entropy[KYBER_GENERATE_KEY_ENTROPY];
  uint8_t encap_entropy[KYBER_ENCAP_ENTROPY];
  uint8_t encapsulated_key[KYBER_SHARED_SECRET_BYTES];
  uint8_t decapsulated_key[KYBER_SHARED_SECRET_BYTES];
  // The test vectors provide a CTR-DRBG seed which is used to generate the
  // input entropy.
  ASSERT_EQ(seed.size(), size_t{CTR_DRBG_ENTROPY_LEN});
  CONSTTIME_SECRET(seed.data(), seed.size());
  {
    bssl::UniquePtr<CTR_DRBG_STATE> state(
        CTR_DRBG_new(seed.data(), nullptr, 0));
    ASSERT_TRUE(state);
    ASSERT_TRUE(
        CTR_DRBG_generate(state.get(), gen_key_entropy, 32, nullptr, 0));
    ASSERT_TRUE(
        CTR_DRBG_generate(state.get(), gen_key_entropy + 32, 32, nullptr, 0));
    ASSERT_TRUE(CTR_DRBG_generate(state.get(), encap_entropy,
                                  KYBER_ENCAP_ENTROPY, nullptr, 0));
  }

  EXPECT_EQ(Bytes(Declassified(gen_key_entropy)),
            Bytes(given_generate_entropy));
  EXPECT_EQ(Bytes(Declassified(encap_entropy)),
            Bytes(given_encap_entropy_pre_hash));

  BORINGSSL_keccak(encap_entropy, sizeof(encap_entropy), encap_entropy,
                   sizeof(encap_entropy), boringssl_sha3_256);

  KYBER_generate_key_external_entropy(encoded_public_key, &priv,
                                      gen_key_entropy);
  CBB cbb;
  CBB_init_fixed(&cbb, encoded_private_key, sizeof(encoded_private_key));
  ASSERT_TRUE(KYBER_marshal_private_key(&cbb, &priv));
  CBS encoded_public_key_cbs;
  CBS_init(&encoded_public_key_cbs, encoded_public_key,
           sizeof(encoded_public_key));
  ASSERT_TRUE(KYBER_parse_public_key(&pub, &encoded_public_key_cbs));
  KYBER_encap_external_entropy(ciphertext, encapsulated_key, &pub,
                               encap_entropy);
  KYBER_decap(decapsulated_key, ciphertext, &priv);

  EXPECT_EQ(Bytes(Declassified(encapsulated_key)),
            Bytes(Declassified(decapsulated_key)));
  EXPECT_EQ(Bytes(private_key_expected),
            Bytes(Declassified(encoded_private_key)));
  EXPECT_EQ(Bytes(public_key_expected), Bytes(encoded_public_key));
  EXPECT_EQ(Bytes(ciphertext_expected), Bytes(ciphertext));
  EXPECT_EQ(Bytes(shared_secret_expected),
            Bytes(Declassified(encapsulated_key)));

  uint8_t corrupted_ciphertext[KYBER_CIPHERTEXT_BYTES];
  OPENSSL_memcpy(corrupted_ciphertext, ciphertext, KYBER_CIPHERTEXT_BYTES);
  corrupted_ciphertext[3] ^= 0x40;
  uint8_t corrupted_decapsulated_key[KYBER_SHARED_SECRET_BYTES];
  KYBER_decap(corrupted_decapsulated_key, corrupted_ciphertext, &priv);
  // It would be nice to have actual test vectors for the failure case, but the
  // NIST submission currently does not include those, so we are just testing
  // for inequality.
  EXPECT_NE(Bytes(Declassified(encapsulated_key)),
            Bytes(Declassified(corrupted_decapsulated_key)));
}